

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::Set(CharSetLeaf *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  ulong uVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2d7,"(level == 0)","level == 0");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  CharBitvec::SetRange(&this->vec,l & 0xff,h & 0xff);
  if ((this->vec).vec[0] == 0xffffffff) {
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 6) goto LAB_00e5a747;
      uVar1 = uVar6 + 1;
      lVar3 = uVar6 + 2;
      uVar6 = uVar1;
    } while ((this->vec).vec[lVar3] == 0xffffffff);
    if (6 < uVar1) {
LAB_00e5a747:
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&allocator->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,this,0x28
                );
      this = (CharSetLeaf *)&CharSetFull::Instance;
    }
  }
  return &this->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetLeaf::Set(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level == 0);
        vec.SetRange(leafIdx(l), leafIdx(h));
        if (vec.IsFull())
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }